

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.h
# Opt level: O2

void __thiscall ImgClass::~ImgClass(ImgClass *this)

{
  if (this->data != (uchar *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~ImgClass() {
        delete []data;
        data = NULL;
    }